

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void StripOnlyChild(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  Node *pNVar2;
  
  pNVar2 = node->content;
  pNVar1 = pNVar2->last;
  node->content = pNVar2->content;
  node->last = pNVar1;
  pNVar2->content = (Node *)0x0;
  prvTidyFreeNode(doc,pNVar2);
  for (pNVar2 = node->content; pNVar2 != (Node *)0x0; pNVar2 = pNVar2->next) {
    pNVar2->parent = node;
  }
  return;
}

Assistant:

static void StripOnlyChild(TidyDocImpl* doc, Node *node)
{
    Node *child;

    child = node->content;
    node->content = child->content;
    node->last = child->last;
    child->content = NULL;
    TY_(FreeNode)(doc, child);

    for (child = node->content; child; child = child->next)
        child->parent = node;
}